

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderTextClipped
               (ImVec2 *pos_min,ImVec2 *pos_max,char *text,char *text_end,ImVec2 *text_size_if_known
               ,ImVec2 *align,ImRect *clip_rect)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  bool bVar3;
  bool bVar4;
  ImRect *pIVar5;
  ImGuiContext *pIVar6;
  ImU32 col;
  char *text_end_00;
  ImVec2 *pIVar7;
  float fVar8;
  ImFont *font;
  ImDrawList *this;
  uint uVar9;
  ImVec2 IVar10;
  float fVar11;
  float fVar12;
  ImVec2 pos;
  ImVec4 *cpu_fine_clip_rect;
  ImVec2 local_70;
  char *local_68;
  ImGuiContext *local_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  float local_38;
  float local_34;
  
  text_end_00 = FindRenderedTextEnd(text,text_end);
  if ((int)text_end_00 != (int)text) {
    local_60 = GImGui;
    pIVar1 = GImGui->CurrentWindow;
    IVar2 = *pos_min;
    local_70 = IVar2;
    if (text_size_if_known == (ImVec2 *)0x0) {
      local_68 = text;
      local_58 = ZEXT416((uint)IVar2.x);
      IVar10 = CalcTextSize(text,text_end_00,false,0.0);
      text = local_68;
      fVar11 = (float)local_58._0_4_;
    }
    else {
      IVar10 = *text_size_if_known;
      fVar11 = IVar2.x;
    }
    pIVar6 = local_60;
    fVar8 = IVar2.y;
    pIVar7 = &clip_rect->Max;
    pIVar5 = clip_rect;
    if (clip_rect == (ImRect *)0x0) {
      pIVar7 = pos_max;
      pIVar5 = (ImRect *)pos_min;
    }
    bVar3 = true;
    if (IVar10.x + fVar11 < pIVar7->x) {
      bVar3 = pIVar7->y <= IVar10.y + fVar8;
    }
    if (clip_rect != (ImRect *)0x0) {
      bVar4 = true;
      if ((clip_rect->Min).x <= fVar11) {
        bVar4 = fVar8 < (clip_rect->Min).y;
      }
      bVar3 = (bool)(bVar3 | bVar4);
    }
    if (0.0 < align->x) {
      fVar12 = ((pos_max->x - fVar11) - IVar10.x) * align->x + fVar11;
      uVar9 = -(uint)(fVar12 <= fVar11);
      local_70.x = (float)(uVar9 & (uint)fVar11 | ~uVar9 & (uint)fVar12);
    }
    if (0.0 < align->y) {
      fVar11 = ((pos_max->y - fVar8) - IVar10.y) * align->y + fVar8;
      uVar9 = -(uint)(fVar11 <= fVar8);
      local_70.y = (float)(uVar9 & (uint)fVar8 | ~uVar9 & (uint)fVar11);
    }
    if (bVar3) {
      local_34 = pIVar7->y;
      local_40 = pIVar5->Min;
      cpu_fine_clip_rect = (ImVec4 *)&local_40;
      this = pIVar1->DrawList;
      font = local_60->Font;
      fVar11 = local_60->FontSize;
      local_38 = pIVar7->x;
      col = GetColorU32(0,1.0);
    }
    else {
      this = pIVar1->DrawList;
      font = local_60->Font;
      fVar11 = local_60->FontSize;
      col = GetColorU32(0,1.0);
      cpu_fine_clip_rect = (ImVec4 *)0x0;
    }
    ImDrawList::AddText(this,font,fVar11,&local_70,col,text,text_end_00,0.0,cpu_fine_clip_rect);
    if (pIVar6->LogEnabled == true) {
      LogRenderedText(&local_70,text,text_end_00);
    }
  }
  return;
}

Assistant:

void ImGui::RenderTextClipped(const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Hide anything after a '##' string
    const char* text_display_end = FindRenderedTextEnd(text, text_end);
    const int text_len = (int)(text_display_end - text);
    if (text_len == 0)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
    if (g.LogEnabled)
        LogRenderedText(&pos, text, text_display_end);
}